

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmGlobalGenerator *this_00;
  undefined8 __args;
  __type _Var1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  FrameworkDescriptor *pFVar7;
  FrameworkFormat format;
  allocator<char> local_319;
  string local_318;
  FeatureDescriptor *local_2f8;
  void *local_2f0;
  ItemIsPath local_2e4;
  string local_2e0;
  byte local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  FeatureDescriptor *local_298;
  void *local_290;
  ItemIsPath local_288;
  allocator<char> local_281;
  string local_280;
  string local_260;
  FrameworkDescriptor *local_240;
  string *fw_path;
  string local_230;
  undefined1 local_200 [8];
  ostringstream e;
  undefined1 local_88 [8];
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  string *item;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  this_00 = this->GlobalGenerator;
  fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>._M_payload
  .super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
  super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._96_8_ = entry;
  _Var1 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
  format = Extended;
  if (_Var1) {
    format = Relaxed;
  }
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_88,this_00,(string *)entry,
             format);
  bVar2 = std::optional::operator_cast_to_bool((optional *)local_88);
  if (bVar2) {
    local_240 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                          ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_88);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      AddFrameworkPath(this,&local_240->Directory);
    }
    pFVar7 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                       ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_88);
    cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_(&local_260,pFVar7);
    AddLibraryRuntimeInfo(this,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    _Var1 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
    if (_Var1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"FRAMEWORK",&local_281);
      AddLibraryFeature(this,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
    }
    uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
    __args = fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>
             ._M_payload.
             super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
             super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._96_8_;
    if ((uVar3 & 1) == 0) {
      pFVar7 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                         ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_88);
      cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_(&local_2e0,pFVar7);
      local_2e4 = Yes;
      local_2f0 = (void *)0x0;
      _Var1 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
      if (_Var1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,"FRAMEWORK",&local_319);
      }
      else {
        std::__cxx11::string::string((string *)&local_318,(string *)&entry->Feature);
      }
      local_2f8 = FindLibraryFeature(this,&local_318);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&local_2e0,&local_2e4,&local_2f0,&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      if (_Var1) {
        std::allocator<char>::~allocator(&local_319);
      }
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    else {
      local_288 = Yes;
      local_290 = (void *)0x0;
      _Var1 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
      local_2ba = 0;
      if (_Var1) {
        std::allocator<char>::allocator();
        local_2ba = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"FRAMEWORK",&local_2b9);
      }
      else {
        std::__cxx11::string::string((string *)&local_2b8,(string *)&entry->Feature);
      }
      local_298 = FindLibraryFeature(this,&local_2b8);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args
                 ,&local_288,&local_290,&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      if ((local_2ba & 1) != 0) {
        std::allocator<char>::~allocator(&local_2b9);
      }
    }
    fw_path._4_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar4 = std::operator<<((ostream *)local_200,"Could not parse framework path \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    fwDescriptor.
                                    super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>
                                    ._96_8_);
    poVar4 = std::operator<<(poVar4,"\" ");
    poVar4 = std::operator<<(poVar4,"linked by target ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,".");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    fw_path._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  }
  std::optional<cmGlobalGenerator::FrameworkDescriptor>::~optional
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_88);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(LinkEntry const& entry)
{
  std::string const& item = entry.Item.Value;

  // Try to separate the framework name and path.
  auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
    item,
    entry.Feature == DEFAULT ? cmGlobalGenerator::FrameworkFormat::Relaxed
                             : cmGlobalGenerator::FrameworkFormat::Extended);
  if (!fwDescriptor) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str());
    return;
  }

  const std::string& fw_path = fwDescriptor->Directory;
  if (!fw_path.empty()) {
    // Add the directory portion to the framework search path.
    this->AddFrameworkPath(fw_path);
  }

  // add runtime information
  this->AddLibraryRuntimeInfo(fwDescriptor->GetFullPath());

  if (entry.Feature == DEFAULT) {
    // ensure FRAMEWORK feature is loaded
    this->AddLibraryFeature("FRAMEWORK");
  }

  if (this->GlobalGenerator->IsXcode()) {
    // Add framework path - it will be handled by Xcode after it's added to
    // "Link Binary With Libraries" build phase
    this->Items.emplace_back(item, ItemIsPath::Yes, nullptr,
                             this->FindLibraryFeature(entry.Feature == DEFAULT
                                                        ? "FRAMEWORK"
                                                        : entry.Feature));
  } else {
    this->Items.emplace_back(
      fwDescriptor->GetLinkName(), ItemIsPath::Yes, nullptr,
      this->FindLibraryFeature(entry.Feature == DEFAULT ? "FRAMEWORK"
                                                        : entry.Feature));
  }
}